

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::Combine<duckdb::SkewState,duckdb::SkewnessOperation>
               (Vector *source,Vector *target,AggregateInputData *aggr_input_data,idx_t count)

{
  data_ptr_t pdVar1;
  data_ptr_t pdVar2;
  long *plVar3;
  long *plVar4;
  double dVar5;
  idx_t iVar6;
  
  if (count != 0) {
    pdVar1 = source->data;
    pdVar2 = target->data;
    iVar6 = 0;
    do {
      plVar3 = *(long **)(pdVar1 + iVar6 * 8);
      if (*plVar3 != 0) {
        plVar4 = *(long **)(pdVar2 + iVar6 * 8);
        *plVar4 = *plVar4 + *plVar3;
        dVar5 = (double)plVar3[2];
        plVar4[1] = (long)((double)plVar4[1] + (double)plVar3[1]);
        plVar4[2] = (long)((double)plVar4[2] + dVar5);
        plVar4[3] = (long)((double)plVar3[3] + (double)plVar4[3]);
      }
      iVar6 = iVar6 + 1;
    } while (count != iVar6);
  }
  return;
}

Assistant:

static void Combine(Vector &source, Vector &target, AggregateInputData &aggr_input_data, idx_t count) {
		D_ASSERT(source.GetType().id() == LogicalTypeId::POINTER && target.GetType().id() == LogicalTypeId::POINTER);
		auto sdata = FlatVector::GetData<const STATE_TYPE *>(source);
		auto tdata = FlatVector::GetData<STATE_TYPE *>(target);

		for (idx_t i = 0; i < count; i++) {
			OP::template Combine<STATE_TYPE, OP>(*sdata[i], *tdata[i], aggr_input_data);
		}
	}